

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_rtti.cpp
# Opt level: O3

void __thiscall L15_5::Magnificent::say(Magnificent *this)

{
  int iVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"I hold the character ",0x15);
  uStack_18 = CONCAT17(this->_ch,(undefined7)uStack_18);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)((long)&uStack_18 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," and the integer ",0x11);
  iVar1 = (**(code **)(*(long *)this + 8))(this);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"!\n",2);
  return;
}

Assistant:

void say() const {
            cout << "I hold the character " << _ch << " and the integer " << this->get_value() << "!\n";
        }